

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamEuler.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementBeamEuler::EvaluateSectionDisplacement
          (ChElementBeamEuler *this,double eta,ChVector<double> *u_displ,ChVector<double> *u_rotaz)

{
  Scalar SVar1;
  double dVar2;
  Scalar SVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  ulong uVar18;
  Scalar *pSVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  ChVectorDynamic<> displ;
  ShapeVector N;
  
  N.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.array[0]._0_4_ =
       (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase
         [3])();
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&displ,(int *)&N);
  (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase[6])
            (this,&displ);
  ShapeFunctions(this,&N,eta);
  uVar18 = CONCAT44(N.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.
                    m_data.array[0]._4_4_,
                    N.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.
                    m_data.array[0]._0_4_);
  pSVar19 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&displ,0);
  SVar1 = *pSVar19;
  pSVar19 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&displ,6);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = SVar1;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = uVar18;
  auVar21._8_8_ = 0;
  auVar21._0_8_ =
       N.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.array[3] *
       *pSVar19;
  auVar20 = vfmadd132sd_fma(auVar30,auVar21,auVar20);
  u_displ->m_data[0] = auVar20._0_8_;
  pSVar19 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&displ,1);
  SVar1 = *pSVar19;
  pSVar19 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&displ,7);
  dVar2 = *pSVar19;
  pSVar19 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&displ,5);
  SVar3 = *pSVar19;
  pSVar19 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&displ,0xb);
  auVar31._8_8_ = 0;
  auVar31._0_8_ = SVar1;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = SVar3;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = N.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.
                 array[1];
  auVar22._8_8_ = 0;
  auVar22._0_8_ =
       dVar2 * N.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.
               array[4];
  auVar20 = vfmadd132sd_fma(auVar31,auVar22,auVar4);
  auVar23._8_8_ = 0;
  auVar23._0_8_ =
       N.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.array[5];
  auVar5._8_8_ = 0;
  auVar5._0_8_ = N.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.
                 array[2];
  auVar20 = vfmadd132sd_fma(auVar36,auVar20,auVar5);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *pSVar19;
  auVar20 = vfmadd231sd_fma(auVar20,auVar23,auVar6);
  u_displ->m_data[1] = auVar20._0_8_;
  pSVar19 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&displ,2);
  SVar1 = *pSVar19;
  pSVar19 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&displ,8);
  dVar2 = *pSVar19;
  pSVar19 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&displ,4);
  SVar3 = *pSVar19;
  pSVar19 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&displ,10);
  auVar32._8_8_ = 0;
  auVar32._0_8_ = SVar1;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = SVar3;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = N.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.
                 array[1];
  auVar24._8_8_ = 0;
  auVar24._0_8_ =
       dVar2 * N.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.
               array[4];
  auVar20 = vfmadd132sd_fma(auVar32,auVar24,auVar7);
  auVar25._8_8_ = 0;
  auVar25._0_8_ =
       N.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.array[5];
  auVar8._8_8_ = 0;
  auVar8._0_8_ = N.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.
                 array[2];
  auVar20 = vfnmadd132sd_fma(auVar37,auVar20,auVar8);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *pSVar19;
  auVar20 = vfnmadd231sd_fma(auVar20,auVar25,auVar9);
  u_displ->m_data[2] = auVar20._0_8_;
  pSVar19 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&displ,3);
  SVar1 = *pSVar19;
  pSVar19 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&displ,9);
  auVar33._8_8_ = 0;
  auVar33._0_8_ = SVar1;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uVar18;
  auVar26._8_8_ = 0;
  auVar26._0_8_ =
       N.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.array[3] *
       *pSVar19;
  auVar20 = vfmadd132sd_fma(auVar33,auVar26,auVar10);
  u_rotaz->m_data[0] = auVar20._0_8_;
  pSVar19 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&displ,2);
  SVar1 = *pSVar19;
  pSVar19 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&displ,8);
  dVar2 = *pSVar19;
  pSVar19 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&displ,4);
  SVar3 = *pSVar19;
  pSVar19 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&displ,10);
  auVar17._8_8_ = 0;
  auVar17._0_8_ =
       N.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.array[6];
  auVar38._8_8_ = 0;
  auVar38._0_8_ = SVar1;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = SVar3;
  auVar16._8_8_ = 0x8000000000000000;
  auVar16._0_8_ = 0x8000000000000000;
  auVar20 = vxorpd_avx512vl(auVar17,auVar16);
  auVar34._8_8_ = 0;
  auVar34._0_8_ =
       dVar2 * N.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.
               array[7];
  auVar20 = vfmsub213sd_fma(auVar38,auVar20,auVar34);
  auVar11._8_8_ = 0;
  auVar11._0_8_ =
       N.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.array[8];
  auVar20 = vfmadd132sd_fma(auVar40,auVar20,auVar11);
  auVar27._8_8_ = 0;
  auVar27._0_8_ =
       N.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.array[9];
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *pSVar19;
  auVar20 = vfmadd231sd_fma(auVar20,auVar27,auVar12);
  u_rotaz->m_data[1] = auVar20._0_8_;
  pSVar19 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&displ,1);
  SVar1 = *pSVar19;
  pSVar19 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&displ,7);
  dVar2 = *pSVar19;
  pSVar19 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&displ,5);
  SVar3 = *pSVar19;
  pSVar19 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&displ,0xb);
  auVar35._8_8_ = 0;
  auVar35._0_8_ = SVar1;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = SVar3;
  auVar13._8_8_ = 0;
  auVar13._0_8_ =
       N.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.array[6];
  auVar28._8_8_ = 0;
  auVar28._0_8_ =
       dVar2 * N.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.
               array[7];
  auVar20 = vfmadd132sd_fma(auVar35,auVar28,auVar13);
  auVar29._8_8_ = 0;
  auVar29._0_8_ =
       N.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.array[9];
  auVar14._8_8_ = 0;
  auVar14._0_8_ =
       N.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.array[8];
  auVar20 = vfmadd132sd_fma(auVar39,auVar20,auVar14);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *pSVar19;
  auVar20 = vfmadd231sd_fma(auVar20,auVar29,auVar15);
  u_rotaz->m_data[2] = auVar20._0_8_;
  Eigen::internal::handmade_aligned_free
            (displ.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  return;
}

Assistant:

void ChElementBeamEuler::EvaluateSectionDisplacement(const double eta, ChVector<>& u_displ, ChVector<>& u_rotaz) {
    ChVectorDynamic<> displ(this->GetNdofs());
    this->GetStateBlock(displ);

    ShapeVector N;
    ShapeFunctions(N, eta);  // Evaluate compressed shape functions

    u_displ.x() = N(0) * displ(0) + N(3) * displ(6);     // x_a   x_b
    u_displ.y() = N(1) * displ(1) + N(4) * displ(7)      // y_a   y_b
                  + N(2) * displ(5) + N(5) * displ(11);  // Rz_a  Rz_b
    u_displ.z() = N(1) * displ(2) + N(4) * displ(8)      // z_a   z_b
                  - N(2) * displ(4) - N(5) * displ(10);  // Ry_a  Ry_b

    u_rotaz.x() = N(0) * displ(3) + N(3) * displ(9);    // Rx_a  Rx_b
    u_rotaz.y() = -N(6) * displ(2) - N(7) * displ(8) +  // z_a   z_b   note - sign
                  N(8) * displ(4) + N(9) * displ(10);   // Ry_a  Ry_b
    u_rotaz.z() = N(6) * displ(1) + N(7) * displ(7) +   // y_a   y_b
                  N(8) * displ(5) + N(9) * displ(11);   // Rz_a  Rz_b
}